

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

GLuint __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::genResultStorage
          (InterCallTestCase *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLuint retVal;
  GLuint local_1c;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  (**(code **)(lVar2 + 0x6c8))(1,&local_1c);
  (**(code **)(lVar2 + 0x40))(0x90d2,local_1c);
  (**(code **)(lVar2 + 0x150))
            (0x90d2,(long)(this->m_invocationGridSize * this->m_invocationGridSize) << 2,0,0x88e4);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"gen buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x6c2);
  return local_1c;
}

Assistant:

glw::GLuint InterCallTestCase::genResultStorage (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	glw::GLuint				retVal	= 0;

	gl.genBuffers(1, &retVal);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, retVal);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, m_invocationGridSize * m_invocationGridSize * sizeof(deUint32), DE_NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffer");

	return retVal;
}